

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall ImgfsFile::NameEntry::~NameEntry(NameEntry *this)

{
  NameEntry *this_local;
  
  (this->super_DirEntry)._vptr_DirEntry = (_func_int **)&PTR__NameEntry_0019c1c0;
  std::__cxx11::string::~string((string *)&this->_name);
  DirEntry::~DirEntry(&this->super_DirEntry);
  return;
}

Assistant:

virtual ~NameEntry() { }